

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O3

Var Js::JavascriptExternalFunction::WrappedFunctionThunk
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ThreadContext *pTVar1;
  Type *this;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ScriptContext *this_00;
  JavascriptMethod p_Var5;
  Var pvVar6;
  int in_stack_00000010;
  Arguments local_48;
  undefined1 auStack_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  args.super_Arguments.Values = (Type)callInfo;
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                ,0xf4,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bc3c0f;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  auStack_38 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)auStack_38,(CallInfo *)&args.super_Arguments.Values);
  this_00 = Js::Type::GetScriptContext((function->type).ptr);
  if ((this_00->threadContext->disableImplicitFlags & DisableImplicitExceptionFlag) !=
      DisableImplicitNoFlag) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                ,0xf7,
                                "(!scriptContext->GetThreadContext()->IsDisableImplicitException())"
                                ,"!scriptContext->GetThreadContext()->IsDisableImplicitException()")
    ;
    if (!bVar3) goto LAB_00bc3c0f;
    *puVar4 = 0;
  }
  ScriptContext::VerifyAlive(this_00,0,(ScriptContext *)0x0);
  if (this_00->threadContext->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                ,0xf9,"(scriptContext->GetThreadContext()->IsScriptActive())",
                                "scriptContext->GetThreadContext()->IsScriptActive()");
    if (!bVar3) goto LAB_00bc3c0f;
    *puVar4 = 0;
  }
  auStack_38 = (undefined1  [8])((ulong)auStack_38 | 0x20000000);
  p_Var5 = FunctionInfo::GetOriginalEntryPoint(*(FunctionInfo **)(function[5].type.ptr + 1));
  if (p_Var5 != ExternalFunctionThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                ,0xff,
                                "(externalFunction->wrappedMethod->GetFunctionInfo()->GetOriginalEntryPoint() == JavascriptExternalFunction::ExternalFunctionThunk)"
                                ,
                                "externalFunction->wrappedMethod->GetFunctionInfo()->GetOriginalEntryPoint() == JavascriptExternalFunction::ExternalFunctionThunk"
                               );
    if (!bVar3) {
LAB_00bc3c0f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pTVar1 = this_00->threadContext;
  bVar3 = pTVar1->reentrancySafeOrHandled;
  pTVar1->reentrancySafeOrHandled = true;
  this = function[5].type.ptr;
  p_Var5 = RecyclableObject::GetEntryPoint((RecyclableObject *)this);
  local_48.Info = (Type)auStack_38;
  local_48.Values = (Type)args.super_Arguments.Info;
  pvVar6 = JavascriptFunction::CallFunction<true>((RecyclableObject *)this,p_Var5,&local_48,false);
  pTVar1->reentrancySafeOrHandled = bVar3;
  return pvVar6;
}

Assistant:

Var JavascriptExternalFunction::WrappedFunctionThunk(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ARGUMENTS(args, callInfo);
        JavascriptExternalFunction* externalFunction = static_cast<JavascriptExternalFunction*>(function);
        ScriptContext* scriptContext = externalFunction->type->GetScriptContext();
        Assert(!scriptContext->GetThreadContext()->IsDisableImplicitException());
        scriptContext->VerifyAlive();
        Assert(scriptContext->GetThreadContext()->IsScriptActive());

        // Make sure the callee knows we are a wrapped function thunk
        args.Info.Flags = (Js::CallFlags) (((int32) args.Info.Flags) | CallFlags_Wrapped);

        // don't need to leave script here, ExternalFunctionThunk will
        Assert(externalFunction->wrappedMethod->GetFunctionInfo()->GetOriginalEntryPoint() == JavascriptExternalFunction::ExternalFunctionThunk);
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return JavascriptFunction::CallFunction<true>(externalFunction->wrappedMethod, externalFunction->wrappedMethod->GetEntryPoint(), args);
        }
        END_SAFE_REENTRANT_CALL
    }